

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# level.c
# Opt level: O0

void release_processed_frames(DECODER_MODEL *decoder_model,double removal_time)

{
  FRAME_BUFFER *pFVar1;
  DECODER_MODEL *in_RDI;
  double in_XMM0_Qa;
  FRAME_BUFFER *this_buffer;
  int i;
  int local_14;
  
  for (local_14 = 0; local_14 < 10; local_14 = local_14 + 1) {
    pFVar1 = in_RDI->frame_buffer_pool + local_14;
    if ((((0 < pFVar1->player_ref_count) && (0.0 <= pFVar1->presentation_time)) &&
        (pFVar1->presentation_time <= in_XMM0_Qa)) &&
       (pFVar1->player_ref_count = 0, pFVar1->decoder_ref_count == 0)) {
      release_buffer(in_RDI,local_14);
    }
  }
  return;
}

Assistant:

static void release_processed_frames(DECODER_MODEL *const decoder_model,
                                     double removal_time) {
  for (int i = 0; i < BUFFER_POOL_MAX_SIZE; ++i) {
    FRAME_BUFFER *const this_buffer = &decoder_model->frame_buffer_pool[i];
    if (this_buffer->player_ref_count > 0) {
      if (this_buffer->presentation_time >= 0.0 &&
          this_buffer->presentation_time <= removal_time) {
        this_buffer->player_ref_count = 0;
        if (this_buffer->decoder_ref_count == 0) {
          release_buffer(decoder_model, i);
        }
      }
    }
  }
}